

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAdvancedBlendEquationTests.cpp
# Opt level: O3

ProgramSources *
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateProgramSources
          (ProgramSources *__return_storage_ptr__,NegativeTestContext *ctx,BlendEquation equation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType CVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  ProgramSources *extraout_RAX;
  undefined8 uVar7;
  pointer pAVar8;
  long lVar9;
  undefined4 uVar10;
  size_type __dnew;
  ostringstream source;
  undefined1 local_338 [8];
  pointer local_330;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *local_328;
  pointer local_320;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_318;
  long local_300;
  AttribLocationBinding local_2f8;
  uint local_2c8;
  value_type local_2c0;
  uint local_2a0;
  value_type local_298;
  undefined1 local_278 [376];
  ProgramSources local_100;
  
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  pcVar4 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)local_338 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0xc0);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\tgl_Position = vec4(0.0);\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base((ios_base *)(local_278 + 0x70));
  local_2a0 = 0;
  paVar1 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_2f8.name.field_2._M_allocated_capacity,
             (undefined1 *)
             (local_2f8.name.field_2._8_8_ + local_2f8.name.field_2._M_allocated_capacity));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2a0,&local_298);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  pcVar4 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)local_338 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0xc0);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  pcVar4 = "#extension GL_KHR_blend_equation_advanced : enable\n";
  if (bVar2) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  lVar9 = 0x33;
  if (bVar2) {
    lVar9 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"layout(",7);
  local_328 = &local_318;
  switch(equation) {
  case BLEND_EQUATION_MULTIPLY:
    local_330 = (pointer)&DAT_00000016;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x756d5f74726f7070;
    *(undefined8 *)
     ((long)&(local_328->
             super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
             )._M_impl.super__Vector_impl_data._M_finish + 6) = 0x796c7069746c756d;
    break;
  case BLEND_EQUATION_SCREEN:
    local_330 = (pointer)0x14;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x63735f74726f7070;
    *(undefined4 *)
     &(local_328->
      super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0x6e656572;
    break;
  case BLEND_EQUATION_OVERLAY:
    local_330 = (pointer)0x15;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x766f5f74726f7070;
    uVar7 = 0x79616c7265766f5f;
    goto LAB_01614d87;
  case BLEND_EQUATION_DARKEN:
    local_330 = (pointer)0x14;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x61645f74726f7070;
    *(undefined4 *)
     &(local_328->
      super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0x6e656b72;
    break;
  case BLEND_EQUATION_LIGHTEN:
    local_330 = (pointer)0x15;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x696c5f74726f7070;
    uVar7 = 0x6e65746867696c5f;
    goto LAB_01614d87;
  case BLEND_EQUATION_COLORDODGE:
    local_330 = (pointer)0x18;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x6f635f74726f7070;
    pAVar8 = (pointer)0x6567646f64726f6c;
    goto LAB_01614ec6;
  case BLEND_EQUATION_COLORBURN:
    local_330 = (pointer)0x17;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x6f635f74726f7070;
    uVar7 = 0x6e727562726f6c6f;
    goto LAB_01614fc4;
  case BLEND_EQUATION_HARDLIGHT:
    local_330 = (pointer)0x17;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x61685f74726f7070;
    uVar7 = 0x746867696c647261;
    goto LAB_01614fc4;
  case BLEND_EQUATION_SOFTLIGHT:
    local_330 = (pointer)0x17;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x6f735f74726f7070;
    uVar7 = 0x746867696c74666f;
    goto LAB_01614fc4;
  case BLEND_EQUATION_DIFFERENCE:
    local_330 = (pointer)0x18;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x69645f74726f7070;
    pAVar8 = (pointer)0x65636e6572656666;
LAB_01614ec6:
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = pAVar8;
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    break;
  case BLEND_EQUATION_EXCLUSION:
    local_330 = (pointer)0x17;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x78655f74726f7070;
    uVar7 = 0x6e6f6973756c6378;
    goto LAB_01614fc4;
  case BLEND_EQUATION_HSL_HUE:
    local_330 = (pointer)0x15;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x73685f74726f7070;
    uVar7 = 0x6575685f6c73685f;
LAB_01614d87:
    *(undefined8 *)
     ((long)&(local_328->
             super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
             )._M_impl.super__Vector_impl_data._M_finish + 5) = uVar7;
    break;
  case BLEND_EQUATION_HSL_SATURATION:
    local_330 = (pointer)0x1c;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    builtin_strncpy((char *)((long)&(local_328->
                                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + 4),"t_hsl_sa",8);
    builtin_strncpy((char *)((long)&(local_328->
                                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                    "turation",8);
    uVar10._0_1_ = 't';
    uVar10._1_1_ = '_';
    uVar10._2_1_ = 'h';
    uVar10._3_1_ = 's';
    goto LAB_01614dc9;
  case BLEND_EQUATION_HSL_COLOR:
    local_330 = (pointer)0x17;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x75735f646e656c62;
    (local_328->
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x73685f74726f7070;
    uVar7 = 0x726f6c6f635f6c73;
LAB_01614fc4:
    *(undefined8 *)
     ((long)&(local_328->
             super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
             )._M_impl.super__Vector_impl_data._M_finish + 7) = uVar7;
    break;
  case BLEND_EQUATION_HSL_LUMINOSITY:
    local_330 = (pointer)0x1c;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    builtin_strncpy((char *)((long)&(local_328->
                                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + 4),"t_hsl_lu",8);
    builtin_strncpy((char *)((long)&(local_328->
                                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                    "minosity",8);
    uVar10._0_1_ = 't';
    uVar10._1_1_ = '_';
    uVar10._2_1_ = 'h';
    uVar10._3_1_ = 's';
    goto LAB_01614dc9;
  case BLEND_EQUATION_ALL_EQUATIONS:
    local_330 = (pointer)0x1b;
    local_328 = (vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = local_330;
    builtin_strncpy((char *)((long)&(local_328->
                                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + 3),"rt_all_e",8);
    builtin_strncpy((char *)((long)&(local_328->
                                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                    "quations",8);
    uVar10._0_1_ = 't';
    uVar10._1_1_ = '_';
    uVar10._2_1_ = 'a';
    uVar10._3_1_ = 'l';
LAB_01614dc9:
    *(undefined4 *)
     &(local_328->
      super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
      _M_impl.super__Vector_impl_data._M_start = 0x6e656c62;
    builtin_strncpy((char *)((long)&(local_328->
                                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 4),"d_su",4);
    *(undefined4 *)
     &(local_328->
      super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>).
      _M_impl.super__Vector_impl_data._M_finish = 0x726f7070;
    *(undefined4 *)
     ((long)&(local_328->
             super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
             )._M_impl.super__Vector_impl_data._M_finish + 4) = uVar10;
    break;
  default:
    uVar7 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_318);
    lVar9 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&__return_storage_ptr__->sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar9));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != -0x18);
    if (local_2c0._M_dataplus._M_p != (pointer)(ulong)equation) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_318.
        super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != &local_2f8) {
      operator_delete(local_318.
                      super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)(local_2f8.name._M_dataplus._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((deUint32 *)local_2f8.name.field_2._M_allocated_capacity != &local_2f8.location) {
      operator_delete((void *)local_2f8.name.field_2._M_allocated_capacity,local_2f8._32_8_ + 1);
    }
    glu::ProgramSources::~ProgramSources(&local_100);
    _Unwind_Resume(uVar7);
  }
  *(undefined1 *)
   ((long)&(local_328->
           super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
           )._M_impl.super__Vector_impl_data._M_start +
   (long)local_318.
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_start) = 0;
  local_330 = local_318.
              super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_320 = local_318.
              super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_278,(char *)local_328,
                      (long)local_318.
                            super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"layout(location=0) out mediump vec4 o_color;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\to_color = vec4(0);\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
  if (local_328 != &local_318) {
    operator_delete(local_328,
                    (ulong)((long)&((local_318.
                                     super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                   _M_p + 1));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base((ios_base *)(local_278 + 0x70));
  local_2c8 = 1;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,
             local_318.
             super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (long)&((local_318.
                      super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->name)._M_dataplus._M_p +
             local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2c8,&local_2c0);
  lVar9 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&__return_storage_ptr__->sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar9),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_100.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&__return_storage_ptr__->attribLocationBindings,&local_100.attribLocationBindings);
  __return_storage_ptr__->transformFeedbackBufferMode = local_100.transformFeedbackBufferMode;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->transformFeedbackVaryings,&local_100.transformFeedbackVaryings);
  __return_storage_ptr__->separable = local_100.separable;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_318.
      super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != &local_2f8) {
    operator_delete(local_318.
                    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (ulong)(local_2f8.name._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((deUint32 *)local_2f8.name.field_2._M_allocated_capacity != &local_2f8.location) {
    operator_delete((void *)local_2f8.name.field_2._M_allocated_capacity,local_2f8._32_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  return extraout_RAX;
}

Assistant:

glu::ProgramSources generateProgramSources (NegativeTestContext& ctx, BlendEquation equation)
{
	return glu::ProgramSources()
		<< glu::VertexSource(generateVertexShaderSource(ctx))
		<< glu::FragmentSource(generateFragmentShaderSource(ctx, equation));
}